

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_brodnik.h
# Opt level: O2

void __thiscall vector_brodnik<unsigned_long>::clear(vector_brodnik<unsigned_long> *this)

{
  pointer ppuVar1;
  pointer ppuVar2;
  uint uVar3;
  
  uVar3 = 0;
  while( true ) {
    ppuVar1 = (this->_index_block).
              super__Vector_base<unsigned_long_*,_std::allocator<unsigned_long_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    ppuVar2 = (this->_index_block).
              super__Vector_base<unsigned_long_*,_std::allocator<unsigned_long_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
    if ((ulong)((long)ppuVar2 - (long)ppuVar1 >> 3) <= (ulong)uVar3) break;
    free(ppuVar1[uVar3]);
    uVar3 = uVar3 + 1;
  }
  if (ppuVar2 != ppuVar1) {
    (this->_index_block).super__Vector_base<unsigned_long_*,_std::allocator<unsigned_long_*>_>.
    _M_impl.super__Vector_impl_data._M_finish = ppuVar1;
  }
  this->_insertpos = (unsigned_long *)0x0;
  this->_left_in_block = 0;
  this->_left_in_superblock = 8;
  this->_superblock_size = 8;
  this->_block_size = 8;
  this->_superblock = '\x06';
  return;
}

Assistant:

void clear()
	{
		for (unsigned i=0; i < _index_block.size(); ++i) {
			free(_index_block[i]);
		}
		_index_block.clear();
		_insertpos = 0;
		_left_in_block = 0;
		_left_in_superblock = InitialSuperBlocksize;
		_block_size = InitialBlocksize;
		_superblock_size = InitialSuperBlocksize;
		_superblock = InitialSuperBlock;
	}